

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFLTKWrapUICommand.cxx
# Opt level: O0

bool cmFLTKWrapUICommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *args,cmExecutionStatus *status)

{
  pointer *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist;
  undefined8 uVar1;
  cmExecutionStatus *this_01;
  bool bVar2;
  size_type sVar3;
  string *psVar4;
  const_reference __lhs;
  cmSourceFile *this_02;
  pointer pcVar5;
  reference ppcVar6;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  cVar7;
  undefined1 auVar8 [16];
  byte local_611;
  anon_class_32_1_6ca262cf local_5a0;
  string_view local_580;
  undefined1 local_570 [8];
  string varName;
  size_t classNum;
  string sourceListValue;
  size_t lastHeadersClass;
  cmSourceFile *sf;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_4f8;
  string local_4f0;
  function<void_(cmSourceFile_*)> local_4d0;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_4b0;
  string local_4a8;
  undefined1 local_488 [8];
  __single_object ccc;
  __single_object hcc;
  basic_string_view<char,_std::char_traits<char>_> local_438;
  basic_string_view<char,_std::char_traits<char>_> local_428;
  undefined1 local_418 [16];
  basic_string_view<char,_std::char_traits<char>_> local_408;
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  iterator local_3d8;
  undefined1 local_3d0 [16];
  cmCustomCommandLines commandLines;
  cmAlphaNum local_380;
  undefined1 local_350 [8];
  string cxxres;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  cmAlphaNum local_2e8;
  undefined1 local_2b8 [8];
  string origname;
  cmAlphaNum local_268;
  undefined1 local_238 [8];
  string hname;
  cmAlphaNum local_1f8;
  cmAlphaNum local_1c8;
  undefined1 local_198 [8];
  string outName;
  string local_170;
  cmSourceFile *local_150;
  cmSourceFile *curr;
  string *arg;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __end1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __begin1;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_120;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_110;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range1;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> generatedSourcesClasses;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputDirectories;
  string outputDirectory;
  string *target;
  string local_a8;
  string *local_88;
  string *fluid_exe;
  string cdir;
  cmMakefile *mf;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  this_01 = local_20;
  if (sVar3 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"called with incorrect number of arguments",&local_41);
    cmExecutionStatus::SetError(this_01,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  else {
    cdir.field_2._8_8_ = cmExecutionStatus::GetMakefile(local_20);
    psVar4 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((cmMakefile *)cdir.field_2._8_8_);
    std::__cxx11::string::string((string *)&fluid_exe,(string *)psVar4);
    uVar1 = cdir.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"FLTK_FLUID_EXECUTABLE",(allocator<char> *)((long)&target + 7));
    psVar4 = cmMakefile::GetRequiredDefinition((cmMakefile *)uVar1,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&target + 7));
    local_88 = psVar4;
    __lhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)status_local,0);
    psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((cmMakefile *)cdir.field_2._8_8_);
    std::__cxx11::string::string
              ((string *)
               &outputDirectories.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)psVar4);
    this = &generatedSourcesClasses.
            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this,(value_type *)
                        &outputDirectories.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmMakefile::AddIncludeDirectories
              ((cmMakefile *)cdir.field_2._8_8_,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&generatedSourcesClasses.
                   super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,false);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&generatedSourcesClasses.
                  super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
              ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&__range1);
    cVar7 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)status_local);
    __begin1 = cVar7.Begin._M_current;
    local_120 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::advance((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)&__begin1,1);
    local_110 = &local_120;
    __end1 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::begin(local_110);
    arg = (string *)
          cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::end(local_110);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&arg);
      if (!bVar2) break;
      curr = (cmSourceFile *)
             __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
      this_02 = cmMakefile::GetSource((cmMakefile *)cdir.field_2._8_8_,(string *)curr,Ambiguous);
      outName.field_2._M_local_buf[0xe] = '\0';
      outName.field_2._M_local_buf[0xd] = '\0';
      local_611 = 1;
      local_150 = this_02;
      if (this_02 != (cmSourceFile *)0x0) {
        std::allocator<char>::allocator();
        outName.field_2._M_local_buf[0xe] = '\x01';
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_170,"WRAP_EXCLUDE",
                   (allocator<char> *)(outName.field_2._M_local_buf + 0xf));
        outName.field_2._M_local_buf[0xd] = '\x01';
        bVar2 = cmSourceFile::GetPropertyAsBool(this_02,&local_170);
        local_611 = bVar2 ^ 0xff;
      }
      if ((outName.field_2._M_local_buf[0xd] & 1U) != 0) {
        std::__cxx11::string::~string((string *)&local_170);
      }
      if ((outName.field_2._M_local_buf[0xe] & 1U) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)(outName.field_2._M_local_buf + 0xf));
      }
      if ((local_611 & 1) != 0) {
        cmAlphaNum::cmAlphaNum
                  (&local_1c8,
                   (string *)
                   &outputDirectories.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        cmAlphaNum::cmAlphaNum(&local_1f8,"/");
        cmsys::SystemTools::GetFilenameWithoutExtension
                  ((string *)((long)&hname.field_2 + 8),(string *)curr);
        cmStrCat<std::__cxx11::string>
                  ((string *)local_198,&local_1c8,&local_1f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&hname.field_2 + 8));
        std::__cxx11::string::~string((string *)(hname.field_2._M_local_buf + 8));
        cmAlphaNum::cmAlphaNum(&local_268,(string *)local_198);
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&origname.field_2 + 8),".h");
        cmStrCat<>((string *)local_238,&local_268,(cmAlphaNum *)((long)&origname.field_2 + 8));
        cmAlphaNum::cmAlphaNum(&local_2e8,(string *)&fluid_exe);
        cmAlphaNum::cmAlphaNum
                  ((cmAlphaNum *)
                   &depends.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"/");
        cmStrCat<std::__cxx11::string>
                  ((string *)local_2b8,&local_2e8,
                   (cmAlphaNum *)
                   &depends.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)curr);
        this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&cxxres.field_2 + 8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(this_00);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(this_00,(value_type *)local_2b8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&cxxres.field_2 + 8),local_88);
        cmAlphaNum::cmAlphaNum(&local_380,(string *)local_198);
        cmAlphaNum::cmAlphaNum
                  ((cmAlphaNum *)
                   &commandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,".cxx");
        cmStrCat<>((string *)local_350,&local_380,
                   (cmAlphaNum *)
                   &commandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        hcc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
        super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
        super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
             (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_88);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_438,"-c");
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_428,"-h");
        auVar8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_238);
        local_418 = auVar8;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_408,"-o");
        auVar8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_350);
        local_3f8 = auVar8;
        auVar8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_2b8);
        local_3d8 = (iterator)&hcc;
        local_3d0._0_8_ = 7;
        ilist._M_len = 7;
        ilist._M_array = local_3d8;
        local_3e8 = auVar8;
        cmMakeSingleCommandLine((cmCustomCommandLines *)(local_3d0 + 8),ilist);
        std::make_unique<cmCustomCommand>();
        pcVar5 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                           ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                            &stack0xfffffffffffffbb0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xfffffffffffffb98,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&cxxres.field_2 + 8));
        cmCustomCommand::SetDepends
                  (pcVar5,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&stack0xfffffffffffffb98);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&stack0xfffffffffffffb98);
        pcVar5 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                           ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                            &stack0xfffffffffffffbb0);
        cmCustomCommandLines::cmCustomCommandLines
                  ((cmCustomCommandLines *)&ccc,(cmCustomCommandLines *)(local_3d0 + 8));
        cmCustomCommand::SetCommandLines(pcVar5,(cmCustomCommandLines *)&ccc);
        cmCustomCommandLines::~cmCustomCommandLines((cmCustomCommandLines *)&ccc);
        std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator*
                  ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                   &stack0xfffffffffffffbb0);
        std::make_unique<cmCustomCommand,cmCustomCommand&>((cmCustomCommand *)local_488);
        pcVar5 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                           ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                            &stack0xfffffffffffffbb0);
        std::__cxx11::string::string((string *)&local_4a8,(string *)local_350);
        cmCustomCommand::SetOutputs(pcVar5,&local_4a8);
        std::__cxx11::string::~string((string *)&local_4a8);
        uVar1 = cdir.field_2._8_8_;
        std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::unique_ptr
                  (&local_4b0,
                   (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                   &stack0xfffffffffffffbb0);
        std::function<void_(cmSourceFile_*)>::function(&local_4d0,(nullptr_t)0x0);
        cmMakefile::AddCustomCommandToOutput((cmMakefile *)uVar1,&local_4b0,&local_4d0,false);
        std::function<void_(cmSourceFile_*)>::~function(&local_4d0);
        std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                  (&local_4b0);
        pcVar5 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                           ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                            local_488);
        std::__cxx11::string::string((string *)&local_4f0,(string *)local_238);
        cmCustomCommand::SetOutputs(pcVar5,&local_4f0);
        std::__cxx11::string::~string((string *)&local_4f0);
        uVar1 = cdir.field_2._8_8_;
        std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::unique_ptr
                  (&local_4f8,
                   (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)local_488);
        std::function<void_(cmSourceFile_*)>::function
                  ((function<void_(cmSourceFile_*)> *)&sf,(nullptr_t)0x0);
        cmMakefile::AddCustomCommandToOutput
                  ((cmMakefile *)uVar1,&local_4f8,(function<void_(cmSourceFile_*)> *)&sf,false);
        std::function<void_(cmSourceFile_*)>::~function((function<void_(cmSourceFile_*)> *)&sf);
        std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                  (&local_4f8);
        lastHeadersClass =
             (size_t)cmMakefile::GetSource
                               ((cmMakefile *)cdir.field_2._8_8_,(string *)local_350,Ambiguous);
        cmSourceFile::AddDepend((cmSourceFile *)lastHeadersClass,(string *)local_238);
        cmSourceFile::AddDepend((cmSourceFile *)lastHeadersClass,(string *)local_2b8);
        std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back
                  ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&__range1,
                   (value_type *)&lastHeadersClass);
        std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                  ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)local_488);
        std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                  ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                   &stack0xfffffffffffffbb0);
        cmCustomCommandLines::~cmCustomCommandLines((cmCustomCommandLines *)(local_3d0 + 8));
        std::__cxx11::string::~string((string *)local_350);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&cxxres.field_2 + 8));
        std::__cxx11::string::~string((string *)local_2b8);
        std::__cxx11::string::~string((string *)local_238);
        std::__cxx11::string::~string((string *)local_198);
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    sourceListValue.field_2._8_8_ =
         std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::size
                   ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&__range1);
    std::__cxx11::string::string((string *)&classNum);
    for (varName.field_2._8_8_ = 0;
        (ulong)varName.field_2._8_8_ < (ulong)sourceListValue.field_2._8_8_;
        varName.field_2._8_8_ = varName.field_2._8_8_ + 1) {
      if (varName.field_2._8_8_ != 0) {
        std::__cxx11::string::operator+=((string *)&classNum,";");
      }
      ppcVar6 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::operator[]
                          ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&__range1,
                           varName.field_2._8_8_);
      psVar4 = cmSourceFile::ResolveFullPath(*ppcVar6,(string *)0x0,(string *)0x0);
      std::__cxx11::string::operator+=((string *)&classNum,(string *)psVar4);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_570,
                   __lhs,"_FLTK_UI_SRCS");
    uVar1 = cdir.field_2._8_8_;
    local_580 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&classNum);
    cmMakefile::AddDefinition((cmMakefile *)uVar1,(string *)local_570,local_580);
    uVar1 = cdir.field_2._8_8_;
    std::__cxx11::string::string((string *)&local_5a0,(string *)__lhs);
    cmMakefile::
    AddGeneratorAction<cmFLTKWrapUICommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::__0>
              ((cmMakefile *)uVar1,&local_5a0);
    cmFLTKWrapUICommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
    ::$_0::~__0((__0 *)&local_5a0);
    args_local._7_1_ = 1;
    std::__cxx11::string::~string((string *)local_570);
    std::__cxx11::string::~string((string *)&classNum);
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
              ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&__range1);
    std::__cxx11::string::~string
              ((string *)
               &outputDirectories.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&fluid_exe);
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmFLTKWrapUICommand(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();

  // what is the current source dir
  std::string cdir = mf.GetCurrentSourceDirectory();
  std::string const& fluid_exe =
    mf.GetRequiredDefinition("FLTK_FLUID_EXECUTABLE");

  // Target that will use the generated files
  std::string const& target = args[0];

  // get the list of GUI files from which .cxx and .h will be generated
  std::string outputDirectory = mf.GetCurrentBinaryDirectory();

  {
    // Some of the generated files are *.h so the directory "GUI"
    // where they are created have to be added to the include path
    std::vector<std::string> outputDirectories;
    outputDirectories.push_back(outputDirectory);
    mf.AddIncludeDirectories(outputDirectories);
  }

  // List of produced files.
  std::vector<cmSourceFile*> generatedSourcesClasses;

  for (std::string const& arg : cmMakeRange(args).advance(1)) {
    cmSourceFile* curr = mf.GetSource(arg);
    // if we should use the source GUI
    // to generate .cxx and .h files
    if (!curr || !curr->GetPropertyAsBool("WRAP_EXCLUDE")) {
      std::string outName = cmStrCat(
        outputDirectory, "/", cmSystemTools::GetFilenameWithoutExtension(arg));
      std::string hname = cmStrCat(outName, ".h");
      std::string origname = cmStrCat(cdir, "/", arg);
      // add starting depends
      std::vector<std::string> depends;
      depends.push_back(origname);
      depends.push_back(fluid_exe);
      std::string cxxres = cmStrCat(outName, ".cxx");

      cmCustomCommandLines commandLines = cmMakeSingleCommandLine({
        fluid_exe,
        "-c", // instructs Fluid to run in command line
        "-h", // optionally rename .h files
        hname,
        "-o", // optionally rename .cxx files
        cxxres,
        origname // name of the GUI fluid file
      });

      // Add command for generating the .h and .cxx files

      auto hcc = cm::make_unique<cmCustomCommand>();
      hcc->SetDepends(depends);
      hcc->SetCommandLines(commandLines);
      auto ccc = cm::make_unique<cmCustomCommand>(*hcc);

      hcc->SetOutputs(cxxres);
      mf.AddCustomCommandToOutput(std::move(hcc));

      ccc->SetOutputs(hname);
      mf.AddCustomCommandToOutput(std::move(ccc));

      cmSourceFile* sf = mf.GetSource(cxxres);
      sf->AddDepend(hname);
      sf->AddDepend(origname);
      generatedSourcesClasses.push_back(sf);
    }
  }

  // create the variable with the list of sources in it
  size_t lastHeadersClass = generatedSourcesClasses.size();
  std::string sourceListValue;
  for (size_t classNum = 0; classNum < lastHeadersClass; classNum++) {
    if (classNum) {
      sourceListValue += ";";
    }
    sourceListValue += generatedSourcesClasses[classNum]->ResolveFullPath();
  }

  std::string const varName = target + "_FLTK_UI_SRCS";
  mf.AddDefinition(varName, sourceListValue);

  mf.AddGeneratorAction(
    [target](cmLocalGenerator& lg, const cmListFileBacktrace& lfbt) {
      FinalAction(*lg.GetMakefile(), target, lfbt);
    });
  return true;
}